

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getImplicitInterface
          (PortConnectionBuilder *this,InterfacePortSymbol *port,SourceRange range,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes,
          bool isWildcard)

{
  Symbol *pSVar1;
  Diagnostic *pDVar2;
  IdentifierNameSyntax *syntax;
  PortConnection *pPVar3;
  string_view name;
  Token id;
  pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
  local_80;
  ASTContext context;
  
  name._M_str = (char *)0x0;
  name._M_len = (size_t)(port->super_Symbol).name._M_str;
  pSVar1 = Lookup::unqualified((Lookup *)this->scope,(Scope *)(port->super_Symbol).name._M_len,name,
                               (bitmask<slang::ast::LookupFlags>)(underlying_type)attributes._M_ptr)
  ;
  if (pSVar1 != (Symbol *)0x0) {
    if ((isWildcard) && (port->isGeneric == true)) {
      pDVar2 = Scope::addDiag(this->scope,(DiagCode)0xe30006,range);
      pDVar2 = Diagnostic::operator<<(pDVar2,(port->super_Symbol).name);
      Diagnostic::addNote(pDVar2,(DiagCode)0x50001,(port->super_Symbol).location);
    }
    parsing::Token::Token
              (&id,&this->comp->super_BumpAllocator,Identifier,
               (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
               (port->super_Symbol).name,range.startLoc);
    syntax = BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
                       (&this->comp->super_BumpAllocator,&id);
    context.scope.ptr = this->scope;
    context.lookupIndex = (this->lookupLocation).index;
    context.flags.m_bits = 0x20;
    context.instanceOrProc = (Symbol *)0x0;
    context.firstTempVar = (TempVarSymbol *)0x0;
    context.randomizeDetails = (RandomizeDetails *)0x0;
    context.assertionInstance = (AssertionInstanceDetails *)0x0;
    getInterfaceConn(&local_80,this,&context,port,(ExpressionSyntax *)syntax);
    pPVar3 = createConnection(this,port,local_80.first,local_80.second,attributes);
    return pPVar3;
  }
  pDVar2 = Scope::addDiag(this->scope,(DiagCode)0x480006,range);
  Diagnostic::operator<<(pDVar2,(port->super_Symbol).name);
  pPVar3 = emptyConnection(this,port);
  return pPVar3;
}

Assistant:

PortConnection* getImplicitInterface(const InterfacePortSymbol& port, SourceRange range,
                                         std::span<const AttributeSymbol* const> attributes,
                                         bool isWildcard) {
        auto symbol = Lookup::unqualified(scope, port.name);
        if (!symbol) {
            scope.addDiag(diag::ImplicitNamedPortNotFound, range) << port.name;
            return emptyConnection(port);
        }

        if (isWildcard && port.isGeneric) {
            auto& diag = scope.addDiag(diag::WildcardPortGenericIface, range) << port.name;
            diag.addNote(diag::NoteDeclarationHere, port.location);
        }

        // This is a bit inefficient but it simplifies the implementation to just
        // wrap the name up in a fake expression and defer to the normal expression
        // handling connection path.
        Token id(comp, TokenKind::Identifier, {}, port.name, range.start());
        auto idName = comp.emplace<IdentifierNameSyntax>(id);

        ASTContext context(scope, lookupLocation, ASTFlags::NonProcedural);
        auto [conn, connExpr] = getInterfaceConn(context, port, *idName);
        return createConnection(port, conn, connExpr, attributes);
    }